

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::throw_exception(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *this)

{
  char *__lhs;
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_00000068;
  string error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_171;
  string local_170 [32];
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [39];
  undefined1 local_c1 [33];
  string local_a0 [32];
  string local_80 [8];
  string *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  string local_60 [55];
  undefined1 local_29 [41];
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffffe70);
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  if ((int)in_RDI[1]._M_string_length == 0xe) {
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_error_message((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)&in_RDI[1].field_2);
    in_stack_fffffffffffffe70 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::get_token_string(in_stack_00000068);
    std::operator+(in_RDI,in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
    std::__cxx11::string::operator+=((string *)(local_29 + 1),local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)(local_c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c1);
  }
  else {
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::token_type_name((token_type)in_RDI[1]._M_string_length);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffffe70);
    std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::__cxx11::string::operator+=((string *)(local_29 + 1),local_108);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  if (*(int *)((long)&in_RDI[5].field_2 + 4) != 0) {
    __lhs = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::token_type_name(*(token_type *)((long)&in_RDI[5].field_2 + 4));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffffe70);
    std::operator+(__lhs,in_stack_fffffffffffffe40);
    std::__cxx11::string::operator+=((string *)(local_29 + 1),local_150);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator(&local_171);
  }
  uVar1 = __cxa_allocate_exception(0x28);
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::get_position((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  *)&in_RDI[1].field_2);
  parse_error::create(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  __cxa_throw(uVar1,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

[[noreturn]] void throw_exception() const
{
std::string error_msg = "syntax error - ";
if (last_token == token_type::parse_error)
{
error_msg += std::string(m_lexer.get_error_message()) + "; last read: '" +
m_lexer.get_token_string() + "'";
}
else
{
error_msg += "unexpected " + std::string(lexer_t::token_type_name(last_token));
}

if (expected != token_type::uninitialized)
{
error_msg += "; expected " + std::string(lexer_t::token_type_name(expected));
}

JSON_THROW(parse_error::create(101, m_lexer.get_position(), error_msg));
}